

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O0

size_t llvm::getDefaultPrecision(FloatStyle Style)

{
  size_t sStack_10;
  FloatStyle Style_local;
  
  if (Style < Fixed) {
    sStack_10 = 6;
  }
  else {
    sStack_10 = 2;
  }
  return sStack_10;
}

Assistant:

size_t llvm::getDefaultPrecision(FloatStyle Style) {
  switch (Style) {
  case FloatStyle::Exponent:
  case FloatStyle::ExponentUpper:
    return 6; // Number of decimal places.
  case FloatStyle::Fixed:
  case FloatStyle::Percent:
    return 2; // Number of decimal places.
  }
  LLVM_BUILTIN_UNREACHABLE;
}